

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

CURLcode AddFormData(FormData **formp,formtype type,void *line,size_t length,curl_off_t *size)

{
  int iVar1;
  void *pvVar2;
  undefined1 local_d0 [8];
  stat file;
  FormData *newform;
  curl_off_t *size_local;
  size_t length_local;
  void *line_local;
  formtype type_local;
  FormData **formp_local;
  
  file.__glibc_reserved[2] = (__syscall_slong_t)(*Curl_cmalloc)(0x20);
  if ((undefined8 *)file.__glibc_reserved[2] == (undefined8 *)0x0) {
    formp_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    *(undefined8 *)file.__glibc_reserved[2] = 0;
    size_local = (curl_off_t *)length;
    if (type < FORM_CALLBACK) {
      if (length == 0) {
        size_local = (curl_off_t *)strlen((char *)line);
      }
      pvVar2 = (*Curl_cmalloc)((long)size_local + 1);
      *(void **)(file.__glibc_reserved[2] + 0x10) = pvVar2;
      if (*(long *)(file.__glibc_reserved[2] + 0x10) == 0) {
        (*Curl_cfree)((void *)file.__glibc_reserved[2]);
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(*(void **)(file.__glibc_reserved[2] + 0x10),line,(size_t)size_local);
      *(curl_off_t **)(file.__glibc_reserved[2] + 0x18) = size_local;
      *(undefined1 *)(*(long *)(file.__glibc_reserved[2] + 0x10) + (long)size_local) = 0;
    }
    else {
      *(void **)(file.__glibc_reserved[2] + 0x10) = line;
    }
    *(formtype *)(file.__glibc_reserved[2] + 8) = type;
    if (*formp == (FormData *)0x0) {
      *formp = (FormData *)file.__glibc_reserved[2];
    }
    else {
      (*formp)->next = (FormData *)file.__glibc_reserved[2];
      *formp = (FormData *)file.__glibc_reserved[2];
    }
    if (size != (curl_off_t *)0x0) {
      if (type == FORM_FILE) {
        iVar1 = curl_strequal("-",*(char **)(file.__glibc_reserved[2] + 0x10));
        if (iVar1 == 0) {
          iVar1 = stat64(*(char **)(file.__glibc_reserved[2] + 0x10),(stat64 *)local_d0);
          if ((iVar1 != 0) || (((uint)file.st_nlink & 0xf000) == 0x4000)) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          *size = file.st_rdev + *size;
        }
      }
      else {
        *size = (long)size_local + *size;
      }
    }
    formp_local._4_4_ = CURLE_OK;
  }
  return formp_local._4_4_;
}

Assistant:

static CURLcode AddFormData(struct FormData **formp,
                            enum formtype type,
                            const void *line,
                            size_t length,
                            curl_off_t *size)
{
  struct FormData *newform = malloc(sizeof(struct FormData));
  if(!newform)
    return CURLE_OUT_OF_MEMORY;
  newform->next = NULL;

  if(type <= FORM_CONTENT) {
    /* we make it easier for plain strings: */
    if(!length)
      length = strlen((char *)line);

    newform->line = malloc(length+1);
    if(!newform->line) {
      free(newform);
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(newform->line, line, length);
    newform->length = length;
    newform->line[length]=0; /* zero terminate for easier debugging */
  }
  else
    /* For callbacks and files we don't have any actual data so we just keep a
       pointer to whatever this points to */
    newform->line = (char *)line;

  newform->type = type;

  if(*formp) {
    (*formp)->next = newform;
    *formp = newform;
  }
  else
    *formp = newform;

  if(size) {
    if(type != FORM_FILE)
      /* for static content as well as callback data we add the size given
         as input argument */
      *size += length;
    else {
      /* Since this is a file to be uploaded here, add the size of the actual
         file */
      if(!strequal("-", newform->line)) {
        struct_stat file;
        if(!stat(newform->line, &file) && !S_ISDIR(file.st_mode))
          *size += filesize(newform->line, file);
        else
          return CURLE_BAD_FUNCTION_ARGUMENT;
      }
    }
  }
  return CURLE_OK;
}